

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
               sqlite3_value **argv)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  i64 iRowid;
  RtreeSearchPoint *pRVar7;
  sqlite3_vtab *psVar8;
  ulong uVar9;
  uint *__src;
  undefined8 *puVar10;
  long lVar11;
  Rtree *pRtree;
  long lVar12;
  long lVar13;
  bool bVar14;
  RtreeNode *pRoot;
  int iCell;
  i64 iNode;
  RtreeNode *pLeaf;
  sqlite3_vtab_cursor local_78;
  Rtree *local_70;
  int local_64;
  long local_60;
  sqlite3_vtab_cursor *local_58;
  sqlite3_value **local_50;
  char *local_48;
  sqlite3_int64 local_40;
  sqlite3_vtab_cursor local_38;
  
  pRtree = (Rtree *)pVtabCursor->pVtab;
  local_78.pVtab = (sqlite3_vtab *)0x0;
  local_64 = 0;
  pRtree->nBusy = pRtree->nBusy + 1;
  local_48 = idxStr;
  freeCursorConstraints((RtreeCursor *)pVtabCursor);
  sqlite3_free(pVtabCursor[6].pVtab);
  psVar8 = pVtabCursor[7].pVtab;
  memset(pVtabCursor,0,0x128);
  pVtabCursor->pVtab = (sqlite3_vtab *)pRtree;
  pVtabCursor[7].pVtab = psVar8;
  *(int *)((long)&pVtabCursor[1].pVtab + 4) = idxNum;
  if (idxNum == 1) {
    iRowid = sqlite3VdbeIntValue(*argv);
    local_40 = 0;
    iVar6 = findLeafNode(pRtree,iRowid,(RtreeNode **)&local_38,&local_40);
    if ((RtreeNode *)local_38.pVtab == (RtreeNode *)0x0 || iVar6 != 0) {
      *(undefined1 *)&pVtabCursor[1].pVtab = 1;
    }
    else {
      pRVar7 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,'\0');
      pVtabCursor[0xb].pVtab = local_38.pVtab;
      pRVar7->id = local_40;
      pRVar7->eWithin = '\x01';
      iVar6 = nodeRowidIndex(pRtree,(RtreeNode *)local_38.pVtab,iRowid,&local_64);
      pRVar7->iCell = (u8)local_64;
    }
  }
  else {
    local_70 = pRtree;
    local_50 = argv;
    iVar6 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,(RtreeNode **)&local_78);
    if (0 < argc && iVar6 == 0) {
      iVar6 = sqlite3_initialize();
      if (iVar6 == 0) {
        psVar8 = (sqlite3_vtab *)sqlite3Malloc((ulong)(uint)argc * 0x18);
      }
      else {
        psVar8 = (sqlite3_vtab *)0x0;
      }
      pVtabCursor[3].pVtab = psVar8;
      *(int *)&pVtabCursor[2].pVtab = argc;
      if (psVar8 == (sqlite3_vtab *)0x0) {
        iVar6 = 7;
      }
      else {
        memset(psVar8,0,(ulong)(uint)argc * 0x18);
        local_58 = pVtabCursor + 0x10;
        memset(local_58,0,(long)local_70->iDepth * 4 + 4);
        uVar9 = 1;
        if (1 < argc) {
          uVar9 = (ulong)(uint)argc;
        }
        lVar12 = uVar9 - 1;
        lVar13 = 0x10;
        iVar6 = 0;
        lVar11 = 0;
        local_60 = lVar12;
        do {
          psVar8 = pVtabCursor[3].pVtab;
          cVar1 = local_48[lVar11 * 2];
          *(int *)((long)psVar8 + lVar13 + -0xc) = (int)cVar1;
          *(int *)((long)psVar8 + lVar13 + -0x10) = local_48[lVar11 * 2 + 1] + -0x30;
          if (cVar1 < 0x46) {
            dVar4 = sqlite3VdbeRealValue(local_50[lVar11]);
            *(double *)((long)psVar8 + lVar13 + -8) = dVar4;
LAB_001c9832:
            bVar5 = false;
          }
          else {
            __src = (uint *)sqlite3_value_pointer(local_50[lVar11],"RtreeMatchArg");
            if (__src == (uint *)0x0) {
              iVar6 = 1;
              bVar14 = false;
            }
            else {
              uVar2 = *__src;
              iVar6 = sqlite3_initialize();
              if (iVar6 == 0) {
                puVar10 = (undefined8 *)sqlite3Malloc((ulong)uVar2 + 0x70);
              }
              else {
                puVar10 = (undefined8 *)0x0;
              }
              if (puVar10 == (undefined8 *)0x0) {
                iVar6 = 7;
                bVar14 = false;
                lVar12 = local_60;
              }
              else {
                puVar10[0xc] = 0;
                puVar10[0xd] = 0;
                puVar10[10] = 0;
                puVar10[0xb] = 0;
                puVar10[8] = 0;
                puVar10[9] = 0;
                puVar10[6] = 0;
                puVar10[7] = 0;
                puVar10[4] = 0;
                puVar10[5] = 0;
                puVar10[2] = 0;
                puVar10[3] = 0;
                *puVar10 = 0;
                puVar10[1] = 0;
                memcpy(puVar10 + 0xe,__src,(ulong)*__src);
                lVar12 = puVar10[0xf];
                *puVar10 = puVar10[0x12];
                *(undefined4 *)(puVar10 + 1) = *(undefined4 *)(puVar10 + 0x13);
                puVar10[2] = puVar10 + 0x15;
                puVar10[0xd] = puVar10[0x14];
                if (lVar12 == 0) {
                  *(undefined4 *)((long)psVar8 + lVar13 + -0xc) = 0x47;
                  lVar12 = puVar10[0x10];
                }
                *(long *)((long)psVar8 + lVar13 + -8) = lVar12;
                *(undefined8 **)((long)&psVar8->pModule + lVar13) = puVar10;
                iVar6 = 0;
                bVar14 = true;
                lVar12 = local_60;
              }
            }
            bVar5 = true;
            if (bVar14) {
              lVar3 = *(long *)((long)&psVar8->pModule + lVar13);
              *(uint *)(lVar3 + 0x38) = (uint)local_70->nDim2;
              *(sqlite3_vtab_cursor **)(lVar3 + 0x30) = local_58;
              *(int *)(lVar3 + 0x40) = local_70->iDepth + 1;
              iVar6 = 0;
              goto LAB_001c9832;
            }
          }
          if (bVar5) break;
          lVar13 = lVar13 + 0x18;
          bVar14 = lVar12 != lVar11;
          lVar11 = lVar11 + 1;
        } while (bVar14);
      }
    }
    pRtree = local_70;
    if (iVar6 == 0) {
      pRVar7 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,(char)local_70->iDepth + '\x01');
      if (pRVar7 == (RtreeSearchPoint *)0x0) {
        return 7;
      }
      pRVar7->id = 1;
      pRVar7->eWithin = '\x01';
      pRVar7->iCell = '\0';
      pVtabCursor[0xb].pVtab = local_78.pVtab;
      local_78.pVtab = (sqlite3_vtab *)0x0;
      iVar6 = rtreeStepToLeaf((RtreeCursor *)pVtabCursor);
    }
  }
  nodeRelease(pRtree,(RtreeNode *)local_78.pVtab);
  rtreeRelease(pRtree);
  return iVar6;
}

Assistant:

static int rtreeFilter(
  sqlite3_vtab_cursor *pVtabCursor, 
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  Rtree *pRtree = (Rtree *)pVtabCursor->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeNode *pRoot = 0;
  int ii;
  int rc = SQLITE_OK;
  int iCell = 0;
  sqlite3_stmt *pStmt;

  rtreeReference(pRtree);

  /* Reset the cursor to the same state as rtreeOpen() leaves it in. */
  freeCursorConstraints(pCsr);
  sqlite3_free(pCsr->aPoint);
  pStmt = pCsr->pReadAux;
  memset(pCsr, 0, sizeof(RtreeCursor));
  pCsr->base.pVtab = (sqlite3_vtab*)pRtree;
  pCsr->pReadAux = pStmt;

  pCsr->iStrategy = idxNum;
  if( idxNum==1 ){
    /* Special case - lookup by rowid. */
    RtreeNode *pLeaf;        /* Leaf on which the required cell resides */
    RtreeSearchPoint *p;     /* Search point for the leaf */
    i64 iRowid = sqlite3_value_int64(argv[0]);
    i64 iNode = 0;
    rc = findLeafNode(pRtree, iRowid, &pLeaf, &iNode);
    if( rc==SQLITE_OK && pLeaf!=0 ){
      p = rtreeSearchPointNew(pCsr, RTREE_ZERO, 0);
      assert( p!=0 );  /* Always returns pCsr->sPoint */
      pCsr->aNode[0] = pLeaf;
      p->id = iNode;
      p->eWithin = PARTLY_WITHIN;
      rc = nodeRowidIndex(pRtree, pLeaf, iRowid, &iCell);
      p->iCell = (u8)iCell;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-F1:");
    }else{
      pCsr->atEOF = 1;
    }
  }else{
    /* Normal case - r-tree scan. Set up the RtreeCursor.aConstraint array 
    ** with the configured constraints. 
    */
    rc = nodeAcquire(pRtree, 1, 0, &pRoot);
    if( rc==SQLITE_OK && argc>0 ){
      pCsr->aConstraint = sqlite3_malloc64(sizeof(RtreeConstraint)*argc);
      pCsr->nConstraint = argc;
      if( !pCsr->aConstraint ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pCsr->aConstraint, 0, sizeof(RtreeConstraint)*argc);
        memset(pCsr->anQueue, 0, sizeof(u32)*(pRtree->iDepth + 1));
        assert( (idxStr==0 && argc==0)
                || (idxStr && (int)strlen(idxStr)==argc*2) );
        for(ii=0; ii<argc; ii++){
          RtreeConstraint *p = &pCsr->aConstraint[ii];
          p->op = idxStr[ii*2];
          p->iCoord = idxStr[ii*2+1]-'0';
          if( p->op>=RTREE_MATCH ){
            /* A MATCH operator. The right-hand-side must be a blob that
            ** can be cast into an RtreeMatchArg object. One created using
            ** an sqlite3_rtree_geometry_callback() SQL user function.
            */
            rc = deserializeGeometry(argv[ii], p);
            if( rc!=SQLITE_OK ){
              break;
            }
            p->pInfo->nCoord = pRtree->nDim2;
            p->pInfo->anQueue = pCsr->anQueue;
            p->pInfo->mxLevel = pRtree->iDepth + 1;
          }else{
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = sqlite3_value_int64(argv[ii]);
#else
            p->u.rValue = sqlite3_value_double(argv[ii]);
#endif
          }
        }
      }
    }
    if( rc==SQLITE_OK ){
      RtreeSearchPoint *pNew;
      pNew = rtreeSearchPointNew(pCsr, RTREE_ZERO, (u8)(pRtree->iDepth+1));
      if( pNew==0 ) return SQLITE_NOMEM;
      pNew->id = 1;
      pNew->iCell = 0;
      pNew->eWithin = PARTLY_WITHIN;
      assert( pCsr->bPoint==1 );
      pCsr->aNode[0] = pRoot;
      pRoot = 0;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-Fm:");
      rc = rtreeStepToLeaf(pCsr);
    }
  }

  nodeRelease(pRtree, pRoot);
  rtreeRelease(pRtree);
  return rc;
}